

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O3

uint32_t __thiscall ans_msb_decode::decode_sym(ans_msb_decode *this,uint64_t *state,uint8_t **in_u8)

{
  uint *puVar1;
  pointer pdVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  
  pdVar2 = (this->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
           super__Vector_impl_data._M_start + (this->frame_mask & *state);
  uVar7 = (ulong)pdVar2->offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar2->freq;
  *state = uVar7;
  puVar6 = *in_u8;
  if (uVar7 < this->lower_bound) {
    puVar1 = (uint *)(puVar6 + -4);
    puVar6 = puVar6 + -4;
    *state = (ulong)*puVar1 | uVar7 << 0x20;
  }
  uVar3 = pdVar2->mapped_num;
  uVar7 = (ulong)(uVar3 >> 0x1e);
  uVar4 = *(uint *)(ans_msb_undo_mapping(dec_entry_msb_const&,unsigned_char_const*&)::except_mask +
                   uVar7 * 4);
  uVar5 = *(uint *)(puVar6 + -uVar7);
  *in_u8 = puVar6 + -uVar7;
  return (uVar4 & uVar5) + (uVar3 & 0x3fffffff);
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_msb_undo_mapping(entry, in_u8);
        return decoded_sym;
    }